

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

QuartetSet * GenerateQuartetTargets(QAM *am)

{
  int iVar1;
  int *piVar2;
  long in_RSI;
  QuartetSet *in_RDI;
  pair<std::_Rb_tree_const_iterator<Quartet>,_bool> pVar3;
  Doublet ket;
  int l;
  Gaussian cur4;
  int k;
  Gaussian cur3;
  Doublet bra;
  int j;
  Gaussian cur2;
  int i;
  Gaussian cur1;
  int nam4;
  int nam3;
  int nam2;
  int nam1;
  QuartetSet *qs;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  value_type *in_stack_fffffffffffffd98;
  set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *psVar4;
  set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *this;
  value_type local_198;
  undefined4 local_f0;
  _Base_ptr local_ec;
  undefined4 local_e4;
  undefined1 local_e0 [48];
  int local_b0;
  undefined1 local_ac [52];
  undefined4 local_78;
  string local_70 [32];
  int local_50;
  undefined8 local_4c;
  undefined4 local_44;
  int local_40;
  undefined8 local_3c;
  undefined4 local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_18;
  undefined1 local_11;
  
  local_11 = 0;
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x11326f);
  piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           in_stack_fffffffffffffd7c);
  iVar1 = *piVar2;
  piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           in_stack_fffffffffffffd7c);
  local_18 = ((iVar1 + 1) * (*piVar2 + 2)) / 2;
  piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           in_stack_fffffffffffffd7c);
  iVar1 = *piVar2;
  piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           in_stack_fffffffffffffd7c);
  local_28 = ((iVar1 + 1) * (*piVar2 + 2)) / 2;
  piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           in_stack_fffffffffffffd7c);
  iVar1 = *piVar2;
  piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           in_stack_fffffffffffffd7c);
  local_2c = ((iVar1 + 1) * (*piVar2 + 2)) / 2;
  piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           in_stack_fffffffffffffd7c);
  iVar1 = *piVar2;
  piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           in_stack_fffffffffffffd7c);
  local_30 = ((iVar1 + 1) * (*piVar2 + 2)) / 2;
  piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           in_stack_fffffffffffffd7c);
  local_3c._0_4_ = *piVar2;
  local_3c._4_4_ = 0;
  local_34 = 0;
  for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
    piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                             in_stack_fffffffffffffd7c);
    local_4c._0_4_ = *piVar2;
    local_4c._4_4_ = 0;
    local_44 = 0;
    for (local_50 = 0; local_50 < local_28; local_50 = local_50 + 1) {
      local_ac._28_4_ = 0;
      local_ac._40_4_ = local_34;
      local_ac._32_8_ = local_3c;
      local_78 = local_44;
      local_ac._44_8_ = local_4c;
      std::__cxx11::string::string(local_70,(string *)(in_RSI + 0x10));
      piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                               in_stack_fffffffffffffd7c);
      local_ac._16_4_ = *piVar2;
      local_ac._20_4_ = 0;
      local_ac._24_4_ = 0;
      for (local_ac._12_4_ = 0; (int)local_ac._12_4_ < local_2c;
          local_ac._12_4_ = local_ac._12_4_ + 1) {
        psVar4 = (set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)local_ac;
        piVar2 = QAM::operator[]((QAM *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80
                                                ),in_stack_fffffffffffffd7c);
        this = psVar4;
        *(int *)&(psVar4->_M_t)._M_impl = *piVar2;
        *(undefined4 *)&(psVar4->_M_t)._M_impl.field_0x4 = 0;
        (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        for (local_b0 = 0; local_b0 < local_30; local_b0 = local_b0 + 1) {
          local_f0 = 1;
          local_e4 = local_ac._24_4_;
          local_ec = (_Base_ptr)local_ac._16_8_;
          local_e0._8_4_ = local_ac._8_4_;
          local_e0._0_8_ = local_ac._0_8_;
          std::__cxx11::string::string((string *)(local_e0 + 0x10),(string *)(in_RSI + 0x10));
          in_stack_fffffffffffffd98 = &local_198;
          Doublet::Doublet((Doublet *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           (Doublet *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))
          ;
          Doublet::Doublet((Doublet *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                           (Doublet *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))
          ;
          local_198.m = 0;
          std::__cxx11::string::string((string *)&local_198.tag,(string *)(in_RSI + 0x10));
          pVar3 = std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::insert
                            (this,in_stack_fffffffffffffd98);
          in_stack_fffffffffffffd87 = pVar3.second;
          Quartet::~Quartet((Quartet *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80)
                           );
          Gaussian::Iterate((Gaussian *)in_stack_fffffffffffffd98);
          Doublet::~Doublet((Doublet *)0x113723);
        }
        Gaussian::Iterate((Gaussian *)in_stack_fffffffffffffd98);
      }
      Gaussian::Iterate((Gaussian *)in_stack_fffffffffffffd98);
      Doublet::~Doublet((Doublet *)0x113834);
    }
    Gaussian::Iterate((Gaussian *)in_stack_fffffffffffffd98);
  }
  return in_RDI;
}

Assistant:

QuartetSet GenerateQuartetTargets(QAM am)
{
    QuartetSet qs;
    int nam1 = ((am[0] + 1) * (am[0] + 2)) / 2;
    int nam2 = ((am[1] + 1) * (am[1] + 2)) / 2;
    int nam3 = ((am[2] + 1) * (am[2] + 2)) / 2;
    int nam4 = ((am[3] + 1) * (am[3] + 2)) / 2;

    Gaussian cur1 = Gaussian{am[0], 0, 0};
    for(int i = 0; i < nam1; i++)
    {
        Gaussian cur2 = Gaussian{am[1], 0, 0};
        for(int j = 0; j < nam2; j++)
        {
            Doublet bra{DoubletType::BRA, cur1, cur2, am.tag};
            Gaussian cur3 = Gaussian{am[2], 0, 0};
            for(int k = 0; k < nam3; k++)
            {
                Gaussian cur4 = Gaussian{am[3], 0, 0};
                for(int l = 0; l < nam4; l++)
                {
                    Doublet ket{DoubletType::KET, cur3, cur4, am.tag};
                    qs.insert(Quartet{bra, ket, 0, am.tag});
                    cur4.Iterate();
                } 

                cur3.Iterate();
            }

            cur2.Iterate(); 
        }       
                
        cur1.Iterate();
    }
                
    return qs;
}